

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::Expression(SQCompiler *this)

{
  ulong uVar1;
  long tok;
  ulong etype;
  SQUnsignedInteger SVar2;
  SQUnsignedInteger SVar3;
  undefined2 uVar4;
  SQInteger SVar5;
  SQInteger SVar6;
  SQInteger SVar7;
  SQOpcode op;
  char *s;
  SQFuncState *pSVar8;
  SQExpState es;
  SQInstruction local_60;
  long local_58;
  SQUnsignedInteger local_50;
  SQInteger local_48;
  SQInteger SStack_40;
  undefined8 local_38;
  
  local_38 = *(undefined8 *)&(this->_es).donot_get;
  local_48 = (this->_es).etype;
  SStack_40 = (this->_es).epos;
  (this->_es).etype = 1;
  (this->_es).epos = -1;
  (this->_es).donot_get = false;
  LogicalOrExp(this);
  tok = this->_token;
  uVar1 = tok - 0x119;
  if ((0x26 < uVar1) || ((0x7000000301U >> (uVar1 & 0x3f) & 1) == 0)) {
    if (tok == 0x3f) {
      SVar6 = SQLexer::Lex(&this->_lex);
      this->_token = SVar6;
      pSVar8 = this->_fs;
      SVar6 = SQFuncState::PopTarget(pSVar8);
      local_60._arg0 = (uchar)SVar6;
      local_60._0_5_ = 0x1e00000000;
      local_60 = (SQInstruction)((ulong)local_60._4_2_ << 0x20);
      SQFuncState::AddInstruction(pSVar8,&local_60);
      SVar2 = (this->_fs->_instructions)._size;
      SVar6 = SQFuncState::PushTarget(this->_fs,-1);
      Expression(this);
      SVar5 = SQFuncState::PopTarget(this->_fs);
      if (SVar6 != SVar5) {
        local_60._arg0 = (uchar)SVar6;
        local_60._0_5_ = 0xa00000000;
        uVar4 = local_60._4_2_;
        local_60.op = (char)uVar4;
        local_60._arg0 = (char)((ushort)uVar4 >> 8);
        local_60._arg1 = (int)SVar5;
        local_60._arg2 = '\0';
        local_60._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_60);
      }
      local_58 = SVar2 - 1;
      SVar3 = (this->_fs->_instructions)._size;
      local_60._arg1 = 0;
      local_60.op = '\x1c';
      local_60._arg0 = '\0';
      local_60._arg2 = '\0';
      local_60._arg3 = '\0';
      local_50 = SVar2;
      SQFuncState::AddInstruction(this->_fs,&local_60);
      Expect(this,0x3a);
      SVar2 = (this->_fs->_instructions)._size;
      Expression(this);
      SVar5 = SQFuncState::PopTarget(this->_fs);
      if (SVar6 != SVar5) {
        local_60._arg0 = (uchar)SVar6;
        local_60._0_5_ = 0xa00000000;
        uVar4 = local_60._4_2_;
        local_60.op = (char)uVar4;
        local_60._arg0 = (char)((ushort)uVar4 >> 8);
        local_60._arg1 = (int)SVar5;
        local_60._arg2 = '\0';
        local_60._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_60);
      }
      SQFuncState::SetIntructionParam
                (this->_fs,SVar2 - 1,1,(this->_fs->_instructions)._size - SVar2);
      SQFuncState::SetIntructionParam(this->_fs,local_58,1,(SVar3 - local_50) + 1);
      this->_fs->_optimization = false;
      goto LAB_0014a535;
    }
    if (tok != 0x3d) goto LAB_0014a535;
  }
  etype = (this->_es).etype;
  SVar6 = (this->_es).epos;
  if (etype == 1) {
    s = "can\'t assign expression";
LAB_0014a4f0:
    Error(this,s);
  }
  else if (etype == 3) {
    s = "\'base\' cannot be modified";
    goto LAB_0014a4f0;
  }
  SVar5 = SQLexer::Lex(&this->_lex);
  this->_token = SVar5;
  Expression(this);
  if (uVar1 < 0x27) {
    if ((0x7000000300U >> (uVar1 & 0x3f) & 1) != 0) {
      EmitCompoundArith(this,tok,etype,SVar6);
      goto LAB_0014a535;
    }
    if (uVar1 != 0) goto LAB_0014a576;
    if ((etype & 0xfffffffffffffffe) != 2) {
      Error(this,"can\'t \'create\' a local slot");
      goto LAB_0014a535;
    }
    op = _OP_NEWSLOT;
  }
  else {
LAB_0014a576:
    if (tok != 0x3d) goto LAB_0014a535;
    if (1 < etype - 2) {
      if (etype == 5) {
        SVar5 = SQFuncState::PopTarget(this->_fs);
        SVar7 = SQFuncState::PushTarget(this->_fs,-1);
        pSVar8 = this->_fs;
        local_60._arg0 = (uchar)SVar7;
        local_60._0_5_ = 0x1f00000000;
        uVar4 = local_60._4_2_;
        local_60.op = (char)uVar4;
        local_60._arg0 = (char)((ushort)uVar4 >> 8);
        local_60._arg1 = (int)SVar6;
        local_60._arg2 = (char)SVar5;
        local_60._arg3 = '\0';
      }
      else {
        if (etype != 4) goto LAB_0014a535;
        SVar6 = SQFuncState::PopTarget(this->_fs);
        SVar5 = SQFuncState::TopTarget(this->_fs);
        pSVar8 = this->_fs;
        local_60._arg0 = (uchar)SVar5;
        local_60._0_5_ = 0xa00000000;
        uVar4 = local_60._4_2_;
        local_60.op = (char)uVar4;
        local_60._arg0 = (char)((ushort)uVar4 >> 8);
        local_60._arg1 = (int)SVar6;
        local_60._arg2 = '\0';
        local_60._arg3 = '\0';
      }
      SQFuncState::AddInstruction(pSVar8,&local_60);
      goto LAB_0014a535;
    }
    op = _OP_SET;
  }
  EmitDerefOp(this,op);
LAB_0014a535:
  *(undefined8 *)&(this->_es).donot_get = local_38;
  (this->_es).etype = local_48;
  (this->_es).epos = SStack_40;
  return;
}

Assistant:

void Expression()
    {
         SQExpState es = _es;
        _es.etype     = EXPR;
        _es.epos      = -1;
        _es.donot_get = false;
        LogicalOrExp();
        switch(_token)  {
        case _SC('='):
        case TK_NEWSLOT:
        case TK_MINUSEQ:
        case TK_PLUSEQ:
        case TK_MULEQ:
        case TK_DIVEQ:
        case TK_MODEQ:{
            SQInteger op = _token;
            SQInteger ds = _es.etype;
            SQInteger pos = _es.epos;
            if(ds == EXPR) Error(_SC("can't assign expression"));
            else if(ds == BASE) Error(_SC("'base' cannot be modified"));
            Lex(); Expression();

            switch(op){
            case TK_NEWSLOT:
                if(ds == OBJECT || ds == BASE)
                    EmitDerefOp(_OP_NEWSLOT);
                else //if _derefstate != DEREF_NO_DEREF && DEREF_FIELD so is the index of a local
                    Error(_SC("can't 'create' a local slot"));
                break;
            case _SC('='): //ASSIGN
                switch(ds) {
                case LOCAL:
                    {
                        SQInteger src = _fs->PopTarget();
                        SQInteger dst = _fs->TopTarget();
                        _fs->AddInstruction(_OP_MOVE, dst, src);
                    }
                    break;
                case OBJECT:
                case BASE:
                    EmitDerefOp(_OP_SET);
                    break;
                case OUTER:
                    {
                        SQInteger src = _fs->PopTarget();
                        SQInteger dst = _fs->PushTarget();
                        _fs->AddInstruction(_OP_SETOUTER, dst, pos, src);
                    }
                }
                break;
            case TK_MINUSEQ:
            case TK_PLUSEQ:
            case TK_MULEQ:
            case TK_DIVEQ:
            case TK_MODEQ:
                EmitCompoundArith(op, ds, pos);
                break;
            }
            }
            break;
        case _SC('?'): {
            Lex();
            _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
            SQInteger jzpos = _fs->GetCurrentPos();
            SQInteger trg = _fs->PushTarget();
            Expression();
            SQInteger first_exp = _fs->PopTarget();
            if(trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
            SQInteger endfirstexp = _fs->GetCurrentPos();
            _fs->AddInstruction(_OP_JMP, 0, 0);
            Expect(_SC(':'));
            SQInteger jmppos = _fs->GetCurrentPos();
            Expression();
            SQInteger second_exp = _fs->PopTarget();
            if(trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);
            _fs->SetIntructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
            _fs->SetIntructionParam(jzpos, 1, endfirstexp - jzpos + 1);
            _fs->SnoozeOpt();
            }
            break;
        }
        _es = es;
    }